

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

ptls_aead_context_t *
ptls_aead_new_direct(ptls_aead_algorithm_t *aead,int is_enc,void *key,void *iv)

{
  int iVar1;
  ptls_aead_context_t *__ptr;
  
  __ptr = (ptls_aead_context_t *)malloc(aead->context_size);
  if (__ptr != (ptls_aead_context_t *)0x0) {
    __ptr->algo = aead;
    __ptr->dispose_crypto = (_func_void_st_ptls_aead_context_t_ptr *)0x0;
    __ptr->do_xor_iv = (_func_void_st_ptls_aead_context_t_ptr_void_ptr_size_t *)0x0;
    __ptr->do_encrypt_init = (_func_void_st_ptls_aead_context_t_ptr_uint64_t_void_ptr_size_t *)0x0;
    __ptr->do_encrypt_update =
         (_func_size_t_st_ptls_aead_context_t_ptr_void_ptr_void_ptr_size_t *)0x0;
    __ptr->do_encrypt_final = (_func_size_t_st_ptls_aead_context_t_ptr_void_ptr *)0x0;
    __ptr->do_encrypt =
         (_func_void_st_ptls_aead_context_t_ptr_void_ptr_void_ptr_size_t_uint64_t_void_ptr_size_t_ptls_aead_supplementary_encryption_t_ptr
          *)0x0;
    __ptr->do_decrypt =
         (_func_size_t_st_ptls_aead_context_t_ptr_void_ptr_void_ptr_size_t_uint64_t_void_ptr_size_t
          *)0x0;
    iVar1 = (*aead->setup_crypto)(__ptr,is_enc,key,iv);
    if (iVar1 == 0) {
      return __ptr;
    }
    free(__ptr);
  }
  return (ptls_aead_context_t *)0x0;
}

Assistant:

ptls_aead_context_t *ptls_aead_new_direct(ptls_aead_algorithm_t *aead, int is_enc, const void *key, const void *iv)
{
    ptls_aead_context_t *ctx;

    if ((ctx = (ptls_aead_context_t *)malloc(aead->context_size)) == NULL)
        return NULL;

    *ctx = (ptls_aead_context_t){aead};

    if (aead->setup_crypto(ctx, is_enc, key, iv) != 0) {
        free(ctx);
        return NULL;
    }

    return ctx;
}